

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall capnp::BuilderCapabilityTable::dropCap(BuilderCapabilityTable *this,uint index)

{
  size_t sVar1;
  Maybe<kj::Own<capnp::ClientHook>_> *this_00;
  Maybe<kj::Own<capnp::ClientHook>_> local_40 [2];
  Fault local_20;
  Fault f;
  uint index_local;
  BuilderCapabilityTable *this_local;
  
  f.exception._4_4_ = index;
  sVar1 = kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::size(&this->table);
  if (index < sVar1) {
    kj::Maybe<kj::Own<capnp::ClientHook>_>::Maybe(local_40,(void *)0x0);
    this_00 = kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::operator[]
                        (&this->table,(ulong)f.exception._4_4_);
    kj::Maybe<kj::Own<capnp::ClientHook>_>::operator=(this_00,local_40);
    kj::Maybe<kj::Own<capnp::ClientHook>_>::~Maybe(local_40);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
               ,0x2b3,FAILED,"index < table.size()","\"Invalid capability descriptor in message.\"",
               (char (*) [42])"Invalid capability descriptor in message.");
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  return;
}

Assistant:

void BuilderCapabilityTable::dropCap(uint index) {
  KJ_ASSERT(index < table.size(), "Invalid capability descriptor in message.") {
    return;
  }
  table[index] = nullptr;
}